

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

cli_option * cli_get_option(char *name,ll_node *parsed)

{
  ll_node *plVar1;
  cli_option *pcVar2;
  
  if (parsed != (ll_node *)0x0) {
    g_cli_get_option_name = name;
    plVar1 = ll_find(parsed,cli_get_option_predicate);
    if (plVar1 == (ll_node *)0x0) {
      pcVar2 = (cli_option *)0x0;
    }
    else {
      pcVar2 = (cli_option *)plVar1->value_ptr;
    }
    return pcVar2;
  }
  return (cli_option *)0x0;
}

Assistant:

const struct cli_option *cli_get_option(char *name, struct ll_node *parsed)
{
	if (parsed == NULL) {
		return NULL;
	}
	g_cli_get_option_name = name;
	struct ll_node *result = ll_find(parsed, &cli_get_option_predicate);
	if (result == NULL) {
		return NULL;
	}
	return result->value_ptr;
}